

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::PrintAction(BaseTag *this)

{
  ostream *poVar1;
  ostream *in_RDX;
  uint in_ESI;
  
  if (in_ESI < 5) {
    poVar1 = std::operator<<(in_RDX,&DAT_0011a590 + *(int *)(&DAT_0011a590 + (ulong)in_ESI * 4));
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  poVar1 = std::operator<<(in_RDX,"Wrong action");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

void BaseTag::PrintAction(ACT_TYPE action, ostream& out) const {
	switch(action) {
		case 0: out << "North" << endl; break;
		case 1: out << "East" << endl; break;
		case 2: out << "South" << endl; break;
		case 3: out << "West" << endl; break;
		case 4: out << "Tag" << endl; break;
		default: out << "Wrong action" << endl; exit(1);
	}
}